

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void variance_double_suite::test_same(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  double *in_stack_ffffffffffffff88;
  double local_70;
  ulong local_68;
  moment_variance<double> filter;
  
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::basic_moment
            (&filter,0.125,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,1.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 1.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x14d,0x10c5cf,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,predicate
            );
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 0.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x14e,0x10c5cf,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_00);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,1.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 1.0;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x150,0x10c5cf,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_01);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 0.0;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x151,0x10c5cf,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push(&filter,1.0);
  local_68 = -(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)1>.normalization)
             & (ulong)(filter.super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                      filter.super_basic_moment<double,_(trial::online::with)1>.normalization);
  local_70 = 1.0;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x153,0x10c5cf,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_03);
  local_68 = -(ulong)(0.0 < filter.normalization) &
             (ulong)(filter.sum.variance / filter.normalization);
  local_70 = 0.0;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x154,0x10c5cf,(char *)&local_68,&local_70,in_stack_ffffffffffffff88,
             predicate_04);
  return;
}

Assistant:

void test_same()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_variance<double> filter(one_over_eight, one_over_four);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
}